

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

void __thiscall ICM::Compiler::PreliminaryCompile::resetNode(PreliminaryCompile *this,Node *node)

{
  reference pvVar1;
  undefined1 local_28 [8];
  Element front;
  Node *node_local;
  PreliminaryCompile *this_local;
  
  front.index = (uint_t)node;
  pvVar1 = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::front
                     (&node->
                       super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>);
  local_28._0_4_ = pvVar1->field_0;
  local_28._4_4_ = *(undefined4 *)&pvVar1->field_0x4;
  front._0_8_ = pvVar1->index;
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::clear
            ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)front.index);
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
            ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)front.index,
             (value_type *)local_28);
  return;
}

Assistant:

void resetNode(Node &node) {
				Element front = node.front();
				node.clear();
				node.push_back(front);
			}